

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::checkValidHere(Forth *this,char *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint __val;
  pointer pVVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  uint uVar11;
  undefined8 uVar12;
  string __str;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pVVar4 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pVVar4[2].start <= this->dataPointer) && (this->dataPointer < pVVar4[2].end)) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,name,&local_a1);
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_40,": HERE outside data space ");
  paVar3 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
  paVar10 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == paVar10) {
    local_60.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_60.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
    local_60._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_60.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_60._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  __val = this->dataPointer;
  uVar8 = 1;
  if (9 < __val) {
    uVar7 = 4;
    uVar11 = __val;
    do {
      uVar8 = uVar7;
      if (uVar11 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_0011ab00;
      }
      if (uVar11 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_0011ab00;
      }
      if (uVar11 < 10000) goto LAB_0011ab00;
      bVar6 = 99999 < uVar11;
      uVar7 = uVar8 + 4;
      uVar11 = uVar11 / 10000;
    } while (bVar6);
    uVar8 = uVar8 + 1;
  }
LAB_0011ab00:
  paVar10 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_a0,(ulong)uVar8,'\0');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_a0._M_dataplus._M_p,(uint)local_a0._M_string_length,__val);
  uVar2 = CONCAT44(local_a0._M_string_length._4_4_,(uint)local_a0._M_string_length) +
          local_60._M_string_length;
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar3) {
    uVar12 = local_60.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < uVar2) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar10) {
      uVar12 = local_a0.field_2._M_allocated_capacity;
    }
    if (uVar2 <= (ulong)uVar12) {
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_a0,0,0,local_60._M_dataplus._M_p,local_60._M_string_length);
      goto LAB_0011ab83;
    }
  }
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_60,local_a0._M_dataplus._M_p,
                     CONCAT44(local_a0._M_string_length._4_4_,(uint)local_a0._M_string_length));
LAB_0011ab83:
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar9->_M_dataplus)._M_p;
  paVar1 = &pbVar9->field_2;
  if (paVar5 == paVar1) {
    local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_80._M_dataplus._M_p = (pointer)paVar5;
  }
  local_80._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar9->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  throwCppExceptionMessage(this,&local_80,errorInvalidAddress);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar10) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar3) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void checkValidHere(const char* name) {
			RUNTIME_ERROR_IF(getDataPointer() < VirtualMemory[vmSegmentDataSpace].start || 
				VirtualMemory[vmSegmentDataSpace].end <= getDataPointer(),
				std::string(name) + ": HERE outside data space "+std::to_string(getDataPointer()),errorInvalidAddress);
		}